

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DumpWriter.cpp
# Opt level: O0

string * __thiscall
OpenMD::DumpWriter::prepareSiteLine_abi_cxx11_
          (DumpWriter *this,StuntDouble *sd,int ioIndex,int siteIndex)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  uint uVar4;
  SnapshotManager *pSVar5;
  double *pdVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  uint in_ECX;
  StuntDouble *in_RDX;
  undefined8 *in_RSI;
  string *in_RDI;
  uint in_R8D;
  RealType density;
  RealType particlePot;
  RealType sPot;
  Vector3d eField;
  RealType fqFrc;
  RealType fqVel;
  RealType fqPos;
  char tempBuffer [4096];
  string line;
  string type;
  string id;
  int sl;
  int rbsl;
  int asl;
  StuntDouble *in_stack_ffffffffffffed10;
  StuntDouble *in_stack_ffffffffffffed18;
  allocator<char> *in_stack_ffffffffffffed40;
  char *in_stack_ffffffffffffed48;
  errorStruct *in_stack_ffffffffffffed50;
  allocator<char> local_1141;
  allocator<char> *local_1140;
  double local_1138;
  double local_1130;
  Vector<double,_3U> local_1128;
  double local_1110;
  double local_1108;
  double local_1100;
  allocator<char> local_10f1;
  string local_10f0 [39];
  allocator<char> local_10c9;
  string local_10c8 [48];
  char local_1098 [4104];
  string local_90 [32];
  string local_70 [32];
  string local_50 [36];
  uint local_2c;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  StuntDouble *local_18;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  pSVar5 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_24 = SnapshotManager::getAtomStorageLayout(pSVar5);
  pSVar5 = SimInfo::getSnapshotManager((SimInfo *)*in_RSI);
  local_28 = SnapshotManager::getRigidBodyStorageLayout(pSVar5);
  local_2c = 0;
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string(local_90);
  bVar3 = StuntDouble::isRigidBody(local_18);
  if (bVar3) {
    local_2c = local_28;
    snprintf(local_1098,0x1000,"%10d           ",(ulong)local_1c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
    std::__cxx11::string::operator=(local_50,local_10c8);
    std::__cxx11::string::~string(local_10c8);
    std::allocator<char>::~allocator(&local_10c9);
  }
  else {
    local_2c = local_24;
    snprintf(local_1098,0x1000,"%10d %10d",(ulong)local_1c,(ulong)local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
    std::__cxx11::string::operator=(local_50,local_10f0);
    std::__cxx11::string::~string(local_10f0);
    std::allocator<char>::~allocator(&local_10f1);
  }
  if ((*(byte *)((long)in_RSI + 0x53) & 1) != 0) {
    if ((local_2c & 0x4000) != 0) {
      std::__cxx11::string::operator+=(local_70,"c");
      local_1100 = StuntDouble::getFlucQPos(in_stack_ffffffffffffed10);
      uVar4 = std::isinf(local_1100);
      if (((uVar4 & 1) != 0) || (uVar4 = std::isnan(local_1100), (uVar4 & 1) != 0)) {
        uVar7 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge for object %s"
                 ,uVar7);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(local_1098,0x1000," %13e ",local_1100);
      std::__cxx11::string::operator+=(local_90,local_1098);
    }
    if ((local_2c & 0x8000) != 0) {
      std::__cxx11::string::operator+=(local_70,"w");
      local_1108 = StuntDouble::getFlucQVel(in_stack_ffffffffffffed10);
      uVar4 = std::isinf(local_1108);
      if (((uVar4 & 1) != 0) || (uVar4 = std::isnan(local_1108), (uVar4 & 1) != 0)) {
        uVar7 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge velocity for object %s"
                 ,uVar7);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(local_1098,0x1000," %13e ",local_1108);
      std::__cxx11::string::operator+=(local_90,local_1098);
    }
    if (((*(byte *)((long)in_RSI + 0x51) & 1) != 0) && ((local_2c & 0x10000) != 0)) {
      std::__cxx11::string::operator+=(local_70,"g");
      local_1110 = StuntDouble::getFlucQFrc(in_stack_ffffffffffffed10);
      uVar4 = std::isinf(local_1110);
      if (((uVar4 & 1) != 0) || (uVar4 = std::isnan(local_1110), (uVar4 & 1) != 0)) {
        uVar7 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "DumpWriter detected a numerical error writing the fluctuating charge force for object %s"
                 ,uVar7);
        painCave.isFatal = 1;
        simError();
      }
      snprintf(local_1098,0x1000," %13e ",local_1110);
      std::__cxx11::string::operator+=(local_90,local_1098);
    }
  }
  if (((*(byte *)((long)in_RSI + 0x54) & 1) == 0) || ((local_2c & 0x1000) == 0)) goto LAB_00194d7c;
  std::__cxx11::string::operator+=(local_70,"e");
  StuntDouble::getElectricField(in_stack_ffffffffffffed18);
  pdVar6 = Vector<double,_3U>::operator[](&local_1128,0);
  uVar4 = std::isinf(*pdVar6);
  if ((uVar4 & 1) == 0) {
    pdVar6 = Vector<double,_3U>::operator[](&local_1128,0);
    uVar4 = std::isnan(*pdVar6);
    if ((uVar4 & 1) != 0) goto LAB_00194c50;
    pdVar6 = Vector<double,_3U>::operator[](&local_1128,1);
    uVar4 = std::isinf(*pdVar6);
    if ((uVar4 & 1) != 0) goto LAB_00194c50;
    pdVar6 = Vector<double,_3U>::operator[](&local_1128,1);
    uVar4 = std::isnan(*pdVar6);
    if ((uVar4 & 1) != 0) goto LAB_00194c50;
    pdVar6 = Vector<double,_3U>::operator[](&local_1128,2);
    uVar4 = std::isinf(*pdVar6);
    if ((uVar4 & 1) != 0) goto LAB_00194c50;
    pdVar6 = Vector<double,_3U>::operator[](&local_1128,2);
    uVar4 = std::isnan(*pdVar6);
    if ((uVar4 & 1) != 0) goto LAB_00194c50;
  }
  else {
LAB_00194c50:
    uVar7 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "DumpWriter detected a numerical error writing the electric field for object %s",uVar7)
    ;
    painCave.isFatal = 1;
    simError();
  }
  pdVar6 = Vector<double,_3U>::operator[](&local_1128,0);
  dVar1 = *pdVar6;
  pdVar6 = Vector<double,_3U>::operator[](&local_1128,1);
  dVar2 = *pdVar6;
  pdVar6 = Vector<double,_3U>::operator[](&local_1128,2);
  snprintf(local_1098,0x1000," %13e %13e %13e",dVar1,dVar2,*pdVar6);
  std::__cxx11::string::operator+=(local_90,local_1098);
LAB_00194d7c:
  if (((*(byte *)((long)in_RSI + 0x55) & 1) != 0) && ((local_2c & 0x20000) != 0)) {
    std::__cxx11::string::operator+=(local_70,"s");
    local_1130 = StuntDouble::getSitePotential(in_stack_ffffffffffffed10);
    uVar4 = std::isinf(local_1130);
    if (((uVar4 & 1) != 0) || (uVar4 = std::isnan(local_1130), (uVar4 & 1) != 0)) {
      uVar7 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the site potential for object %s",
               uVar7);
      painCave.isFatal = 1;
      simError();
    }
    snprintf(local_1098,0x1000," %13e ",local_1130);
    std::__cxx11::string::operator+=(local_90,local_1098);
  }
  if (((*(byte *)((long)in_RSI + 0x52) & 1) != 0) && ((local_2c & 0x40) != 0)) {
    std::__cxx11::string::operator+=(local_70,"u");
    local_1138 = StuntDouble::getParticlePot(in_stack_ffffffffffffed10);
    uVar4 = std::isinf(local_1138);
    if (((uVar4 & 1) != 0) || (uVar4 = std::isnan(local_1138), (uVar4 & 1) != 0)) {
      uVar7 = std::__cxx11::string::c_str();
      in_stack_ffffffffffffed50 = &painCave;
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the particle  potential for object %s"
               ,uVar7);
      *(undefined4 *)((long)in_stack_ffffffffffffed50->errMsg + 2000) = 1;
      simError();
    }
    in_stack_ffffffffffffed48 = local_1098;
    snprintf(in_stack_ffffffffffffed48,0x1000," %13e",local_1138);
    std::__cxx11::string::operator+=(local_90,in_stack_ffffffffffffed48);
  }
  if (((*(byte *)((long)in_RSI + 0x56) & 1) != 0) && ((local_2c & 0x80) != 0)) {
    std::__cxx11::string::operator+=(local_70,"d");
    in_stack_ffffffffffffed40 =
         (allocator<char> *)StuntDouble::getDensity(in_stack_ffffffffffffed10);
    local_1140 = in_stack_ffffffffffffed40;
    uVar4 = std::isinf((double)in_stack_ffffffffffffed40);
    if (((uVar4 & 1) != 0) || (uVar4 = std::isnan((double)local_1140), (uVar4 & 1) != 0)) {
      uVar7 = std::__cxx11::string::c_str();
      snprintf(painCave.errMsg,2000,
               "DumpWriter detected a numerical error writing the density  for object %s",uVar7);
      painCave.isFatal = 1;
      simError();
    }
    snprintf(local_1098,0x1000," %13e",local_1140);
    std::__cxx11::string::operator+=(local_90,local_1098);
  }
  uVar7 = std::__cxx11::string::c_str();
  uVar8 = std::__cxx11::string::c_str();
  uVar9 = std::__cxx11::string::c_str();
  snprintf(local_1098,0x1000,"%s %7s %s\n",uVar7,uVar8,uVar9,uVar7,uVar8,local_1098);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffed50,in_stack_ffffffffffffed48,in_stack_ffffffffffffed40);
  std::allocator<char>::~allocator(&local_1141);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string DumpWriter::prepareSiteLine(StuntDouble* sd, int ioIndex,
                                          int siteIndex) {
    int asl  = info_->getSnapshotManager()->getAtomStorageLayout();
    int rbsl = info_->getSnapshotManager()->getRigidBodyStorageLayout();
    int sl {};

    std::string id;
    std::string type;
    std::string line;
    char tempBuffer[4096];

    if (sd->isRigidBody()) {
      sl = rbsl;
      snprintf(tempBuffer, 4096, "%10d           ", ioIndex);
      id = std::string(tempBuffer);
    } else {
      sl = asl;
      snprintf(tempBuffer, 4096, "%10d %10d", ioIndex, siteIndex);
      id = std::string(tempBuffer);
    }

    if (needFlucQ_) {
      if (sl & DataStorage::dslFlucQPosition) {
        type += "c";
        RealType fqPos = sd->getFlucQPos();
        if (std::isinf(fqPos) || std::isnan(fqPos)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " fluctuating charge for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", fqPos);
        line += tempBuffer;
      }

      if (sl & DataStorage::dslFlucQVelocity) {
        type += "w";
        RealType fqVel = sd->getFlucQVel();
        if (std::isinf(fqVel) || std::isnan(fqVel)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " fluctuating charge velocity for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", fqVel);
        line += tempBuffer;
      }

      if (needForceVector_) {
        if (sl & DataStorage::dslFlucQForce) {
          type += "g";
          RealType fqFrc = sd->getFlucQFrc();
          if (std::isinf(fqFrc) || std::isnan(fqFrc)) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "DumpWriter detected a numerical error writing the"
                     " fluctuating charge force for object %s",
                     id.c_str());
            painCave.isFatal = 1;
            simError();
          }
          snprintf(tempBuffer, 4096, " %13e ", fqFrc);
          line += tempBuffer;
        }
      }
    }

    if (needElectricField_) {
      if (sl & DataStorage::dslElectricField) {
        type += "e";
        Vector3d eField = sd->getElectricField();
        if (std::isinf(eField[0]) || std::isnan(eField[0]) ||
            std::isinf(eField[1]) || std::isnan(eField[1]) ||
            std::isinf(eField[2]) || std::isnan(eField[2])) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the electric"
                   " field for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e %13e %13e", eField[0], eField[1],
                 eField[2]);
        line += tempBuffer;
      }
    }

    if (needSitePotential_) {
      if (sl & DataStorage::dslSitePotential) {
        type += "s";
        RealType sPot = sd->getSitePotential();
        if (std::isinf(sPot) || std::isnan(sPot)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the"
                   " site potential for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e ", sPot);
        line += tempBuffer;
      }
    }

    if (needParticlePot_) {
      if (sl & DataStorage::dslParticlePot) {
        type += "u";
        RealType particlePot = sd->getParticlePot();
        if (std::isinf(particlePot) || std::isnan(particlePot)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the particle "
                   " potential for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e", particlePot);
        line += tempBuffer;
      }
    }

    if (needDensity_) {
      if (sl & DataStorage::dslDensity) {
        type += "d";
        RealType density = sd->getDensity();
        if (std::isinf(density) || std::isnan(density)) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "DumpWriter detected a numerical error writing the density "
                   " for object %s",
                   id.c_str());
          painCave.isFatal = 1;
          simError();
        }
        snprintf(tempBuffer, 4096, " %13e", density);
        line += tempBuffer;
      }
    }

    snprintf(tempBuffer, 4096, "%s %7s %s\n", id.c_str(), type.c_str(),
             line.c_str());
    return std::string(tempBuffer);
  }